

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans.c
# Opt level: O0

void ihevc_itrans_32x32(WORD16 *pi2_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,
                       WORD32 i4_shift,WORD32 zero_cols)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  int in_ECX;
  int in_EDX;
  void *in_RSI;
  short *in_RDI;
  undefined4 in_R8D;
  uint in_R9D;
  WORD32 add;
  WORD32 eeeo [2];
  WORD32 eeee [2];
  WORD32 eeo [4];
  WORD32 eee [4];
  WORD32 eo [8];
  WORD32 ee [8];
  WORD32 o [16];
  WORD32 e [16];
  WORD32 k;
  WORD32 j;
  undefined2 local_12c;
  undefined2 local_128;
  undefined2 local_124;
  undefined2 local_120;
  int aiStack_108 [16];
  int aiStack_c8 [8];
  int aiStack_a8 [16];
  int aiStack_68 [16];
  int local_28;
  int local_24;
  uint local_20;
  undefined4 local_1c;
  int local_18;
  int local_14;
  void *local_10;
  short *local_8;
  
  iVar1 = 1 << ((char)in_R8D - 1U & 0x1f);
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_24 = 0; local_24 < 0x20; local_24 = local_24 + 1) {
    if ((local_20 & 1) == 1) {
      memset(local_10,0,0x40);
    }
    else {
      for (local_28 = 0; local_28 < 0x10; local_28 = local_28 + 1) {
        aiStack_a8[local_28] =
             (int)g_ai2_ihevc_trans_32[1][local_28] * (int)local_8[local_14] +
             (int)g_ai2_ihevc_trans_32[3][local_28] * (int)local_8[local_14 * 3] +
             (int)g_ai2_ihevc_trans_32[5][local_28] * (int)local_8[local_14 * 5] +
             (int)g_ai2_ihevc_trans_32[7][local_28] * (int)local_8[local_14 * 7] +
             (int)g_ai2_ihevc_trans_32[9][local_28] * (int)local_8[local_14 * 9] +
             (int)g_ai2_ihevc_trans_32[0xb][local_28] * (int)local_8[local_14 * 0xb] +
             (int)g_ai2_ihevc_trans_32[0xd][local_28] * (int)local_8[local_14 * 0xd] +
             (int)g_ai2_ihevc_trans_32[0xf][local_28] * (int)local_8[local_14 * 0xf] +
             (int)g_ai2_ihevc_trans_32[0x11][local_28] * (int)local_8[local_14 * 0x11] +
             (int)g_ai2_ihevc_trans_32[0x13][local_28] * (int)local_8[local_14 * 0x13] +
             (int)g_ai2_ihevc_trans_32[0x15][local_28] * (int)local_8[local_14 * 0x15] +
             (int)g_ai2_ihevc_trans_32[0x17][local_28] * (int)local_8[local_14 * 0x17] +
             (int)g_ai2_ihevc_trans_32[0x19][local_28] * (int)local_8[local_14 * 0x19] +
             (int)g_ai2_ihevc_trans_32[0x1b][local_28] * (int)local_8[local_14 * 0x1b] +
             (int)g_ai2_ihevc_trans_32[0x1d][local_28] * (int)local_8[local_14 * 0x1d] +
             (int)g_ai2_ihevc_trans_32[0x1f][local_28] * (int)local_8[local_14 * 0x1f];
      }
      for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
        aiStack_108[(long)local_28 + 8] =
             (int)g_ai2_ihevc_trans_32[2][local_28] * (int)local_8[local_14 << 1] +
             (int)g_ai2_ihevc_trans_32[6][local_28] * (int)local_8[local_14 * 6] +
             (int)g_ai2_ihevc_trans_32[10][local_28] * (int)local_8[local_14 * 10] +
             (int)g_ai2_ihevc_trans_32[0xe][local_28] * (int)local_8[local_14 * 0xe] +
             (int)g_ai2_ihevc_trans_32[0x12][local_28] * (int)local_8[local_14 * 0x12] +
             (int)g_ai2_ihevc_trans_32[0x16][local_28] * (int)local_8[local_14 * 0x16] +
             (int)g_ai2_ihevc_trans_32[0x1a][local_28] * (int)local_8[local_14 * 0x1a] +
             (int)g_ai2_ihevc_trans_32[0x1e][local_28] * (int)local_8[local_14 * 0x1e];
      }
      for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
        aiStack_108[local_28] =
             (int)g_ai2_ihevc_trans_32[4][local_28] * (int)local_8[local_14 << 2] +
             (int)g_ai2_ihevc_trans_32[0xc][local_28] * (int)local_8[local_14 * 0xc] +
             (int)g_ai2_ihevc_trans_32[0x14][local_28] * (int)local_8[local_14 * 0x14] +
             (int)g_ai2_ihevc_trans_32[0x1c][local_28] * (int)local_8[local_14 * 0x1c];
      }
      iVar2 = local_8[local_14 << 3] * 0x53 + local_8[local_14 * 0x18] * 0x24;
      iVar3 = local_8[local_14 << 3] * 0x24 + local_8[local_14 * 0x18] * -0x53;
      iVar4 = *local_8 * 0x40 + local_8[local_14 << 4] * 0x40;
      iVar5 = *local_8 * 0x40 + local_8[local_14 << 4] * -0x40;
      aiStack_108[4] = iVar4 + iVar2;
      aiStack_108[7] = iVar4 - iVar2;
      aiStack_108[5] = iVar5 + iVar3;
      aiStack_108[6] = iVar5 - iVar3;
      for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
        aiStack_c8[local_28] = aiStack_108[(long)local_28 + 4] + aiStack_108[local_28];
        aiStack_c8[local_28 + 4] = aiStack_108[(long)(3 - local_28) + 4] - aiStack_108[3 - local_28]
        ;
      }
      for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
        aiStack_68[local_28] = aiStack_c8[local_28] + aiStack_108[(long)local_28 + 8];
        aiStack_68[local_28 + 8] = aiStack_c8[7 - local_28] - aiStack_108[(long)(7 - local_28) + 8];
      }
      for (local_28 = 0; local_28 < 0x10; local_28 = local_28 + 1) {
        bVar6 = (byte)local_1c;
        if (aiStack_68[local_28] + aiStack_a8[local_28] + iVar1 >> (bVar6 & 0x1f) < 0x8000) {
          if (aiStack_68[local_28] + aiStack_a8[local_28] + iVar1 >> (bVar6 & 0x1f) < -0x8000) {
            local_124 = 0x8000;
          }
          else {
            local_124 = (undefined2)
                        (aiStack_68[local_28] + aiStack_a8[local_28] + iVar1 >> (bVar6 & 0x1f));
          }
          local_120 = local_124;
        }
        else {
          local_120 = 0x7fff;
        }
        *(undefined2 *)((long)local_10 + (long)local_28 * 2) = local_120;
        if ((aiStack_68[0xf - local_28] - aiStack_a8[0xf - local_28]) + iVar1 >> (bVar6 & 0x1f) <
            0x8000) {
          if ((aiStack_68[0xf - local_28] - aiStack_a8[0xf - local_28]) + iVar1 >> (bVar6 & 0x1f) <
              -0x8000) {
            local_12c = 0x8000;
          }
          else {
            local_12c = (undefined2)
                        ((aiStack_68[0xf - local_28] - aiStack_a8[0xf - local_28]) + iVar1 >>
                        (bVar6 & 0x1f));
          }
          local_128 = local_12c;
        }
        else {
          local_128 = 0x7fff;
        }
        *(undefined2 *)((long)local_10 + (long)(local_28 + 0x10) * 2) = local_128;
      }
    }
    local_8 = local_8 + 1;
    local_10 = (void *)((long)local_10 + (long)local_18 * 2);
    local_20 = (int)local_20 >> 1;
  }
  return;
}

Assistant:

void ihevc_itrans_32x32(WORD16 *pi2_src,
                        WORD16 *pi2_dst,
                        WORD32 src_strd,
                        WORD32 dst_strd,
                        WORD32 i4_shift,
                        WORD32 zero_cols)
{
    WORD32 j, k;
    WORD32 e[16], o[16];
    WORD32 ee[8], eo[8];
    WORD32 eee[4], eeo[4];
    WORD32 eeee[2], eeeo[2];
    WORD32 add;

    add = 1 << (i4_shift - 1);

    for(j = 0; j < TRANS_SIZE_32; j++)
    {
        /* Checking for Zero Cols */
        if((zero_cols & 1) == 1)
        {
            memset(pi2_dst, 0, TRANS_SIZE_32 * sizeof(WORD16));
        }
        else
        {
            /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
            for(k = 0; k < 16; k++)
            {
                o[k] = g_ai2_ihevc_trans_32[1][k] * pi2_src[src_strd]
                                + g_ai2_ihevc_trans_32[3][k]
                                                * pi2_src[3 * src_strd]
                                + g_ai2_ihevc_trans_32[5][k]
                                                * pi2_src[5 * src_strd]
                                + g_ai2_ihevc_trans_32[7][k]
                                                * pi2_src[7 * src_strd]
                                + g_ai2_ihevc_trans_32[9][k]
                                                * pi2_src[9 * src_strd]
                                + g_ai2_ihevc_trans_32[11][k]
                                                * pi2_src[11 * src_strd]
                                + g_ai2_ihevc_trans_32[13][k]
                                                * pi2_src[13 * src_strd]
                                + g_ai2_ihevc_trans_32[15][k]
                                                * pi2_src[15 * src_strd]
                                + g_ai2_ihevc_trans_32[17][k]
                                                * pi2_src[17 * src_strd]
                                + g_ai2_ihevc_trans_32[19][k]
                                                * pi2_src[19 * src_strd]
                                + g_ai2_ihevc_trans_32[21][k]
                                                * pi2_src[21 * src_strd]
                                + g_ai2_ihevc_trans_32[23][k]
                                                * pi2_src[23 * src_strd]
                                + g_ai2_ihevc_trans_32[25][k]
                                                * pi2_src[25 * src_strd]
                                + g_ai2_ihevc_trans_32[27][k]
                                                * pi2_src[27 * src_strd]
                                + g_ai2_ihevc_trans_32[29][k]
                                                * pi2_src[29 * src_strd]
                                + g_ai2_ihevc_trans_32[31][k]
                                                * pi2_src[31 * src_strd];
            }
            for(k = 0; k < 8; k++)
            {
                eo[k] = g_ai2_ihevc_trans_32[2][k] * pi2_src[2 * src_strd]
                                + g_ai2_ihevc_trans_32[6][k]
                                                * pi2_src[6 * src_strd]
                                + g_ai2_ihevc_trans_32[10][k]
                                                * pi2_src[10 * src_strd]
                                + g_ai2_ihevc_trans_32[14][k]
                                                * pi2_src[14 * src_strd]
                                + g_ai2_ihevc_trans_32[18][k]
                                                * pi2_src[18 * src_strd]
                                + g_ai2_ihevc_trans_32[22][k]
                                                * pi2_src[22 * src_strd]
                                + g_ai2_ihevc_trans_32[26][k]
                                                * pi2_src[26 * src_strd]
                                + g_ai2_ihevc_trans_32[30][k]
                                                * pi2_src[30 * src_strd];
            }
            for(k = 0; k < 4; k++)
            {
                eeo[k] = g_ai2_ihevc_trans_32[4][k] * pi2_src[4 * src_strd]
                                + g_ai2_ihevc_trans_32[12][k]
                                                * pi2_src[12 * src_strd]
                                + g_ai2_ihevc_trans_32[20][k]
                                                * pi2_src[20 * src_strd]
                                + g_ai2_ihevc_trans_32[28][k]
                                                * pi2_src[28 * src_strd];
            }
            eeeo[0] = g_ai2_ihevc_trans_32[8][0] * pi2_src[8 * src_strd]
                            + g_ai2_ihevc_trans_32[24][0]
                                            * pi2_src[24 * src_strd];
            eeeo[1] = g_ai2_ihevc_trans_32[8][1] * pi2_src[8 * src_strd]
                            + g_ai2_ihevc_trans_32[24][1]
                                            * pi2_src[24 * src_strd];
            eeee[0] = g_ai2_ihevc_trans_32[0][0] * pi2_src[0]
                            + g_ai2_ihevc_trans_32[16][0]
                                            * pi2_src[16 * src_strd];
            eeee[1] = g_ai2_ihevc_trans_32[0][1] * pi2_src[0]
                            + g_ai2_ihevc_trans_32[16][1]
                                            * pi2_src[16 * src_strd];

            /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
            eee[0] = eeee[0] + eeeo[0];
            eee[3] = eeee[0] - eeeo[0];
            eee[1] = eeee[1] + eeeo[1];
            eee[2] = eeee[1] - eeeo[1];
            for(k = 0; k < 4; k++)
            {
                ee[k] = eee[k] + eeo[k];
                ee[k + 4] = eee[3 - k] - eeo[3 - k];
            }
            for(k = 0; k < 8; k++)
            {
                e[k] = ee[k] + eo[k];
                e[k + 8] = ee[7 - k] - eo[7 - k];
            }
            for(k = 0; k < 16; k++)
            {
                pi2_dst[k] =
                                CLIP_S16(((e[k] + o[k] + add) >> i4_shift));
                pi2_dst[k + 16] =
                                CLIP_S16(((e[15 - k] - o[15 - k] + add) >> i4_shift));
            }
        }
        pi2_src++;
        pi2_dst += dst_strd;
        zero_cols = zero_cols >> 1;
    }
}